

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

int fe_equal(secp256k1_fe *a,secp256k1_fe *b)

{
  int iVar1;
  void *in_RSI;
  void *in_RDI;
  secp256k1_fe bn;
  secp256k1_fe an;
  undefined1 local_60 [24];
  secp256k1_fe *in_stack_ffffffffffffffb8;
  secp256k1_fe *in_stack_ffffffffffffffc0;
  secp256k1_fe local_38;
  void *local_10;
  
  local_10 = in_RSI;
  memcpy(&local_38,in_RDI,0x28);
  memcpy(local_60,local_10,0x28);
  secp256k1_fe_impl_normalize_weak(&local_38);
  iVar1 = secp256k1_fe_equal(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  return iVar1;
}

Assistant:

static int fe_equal(const secp256k1_fe *a, const secp256k1_fe *b) {
    secp256k1_fe an = *a;
    secp256k1_fe bn = *b;
    secp256k1_fe_normalize_weak(&an);
    return secp256k1_fe_equal(&an, &bn);
}